

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O0

void my_numbox_draw_config(t_my_numbox *x,_glist *glist)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  _glist *p_Var8;
  undefined8 in_stack_fffffffffffffe58;
  undefined4 uVar10;
  undefined8 uVar9;
  undefined8 in_stack_fffffffffffffe60;
  undefined4 uVar11;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 uVar14;
  ulong uVar12;
  undefined8 uVar13;
  undefined8 in_stack_fffffffffffffe70;
  undefined4 uVar16;
  undefined8 uVar15;
  undefined8 in_stack_fffffffffffffe78;
  undefined4 uVar17;
  undefined4 local_138 [2];
  t_atom fontatoms [3];
  int local_100;
  int local_fc;
  int fcol;
  int lcol;
  char tag [128];
  int ioh;
  int iow;
  int corner;
  int d;
  int half;
  int w;
  int ypos;
  int xpos;
  t_iemgui *iemgui;
  _glist *canvas;
  int zoom;
  _glist *glist_local;
  t_my_numbox *x_local;
  
  uVar17 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  uVar16 = (undefined4)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  uVar14 = (undefined4)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  p_Var8 = glist_getcanvas(glist);
  uVar4 = text_xpix((t_text *)x,glist);
  iVar5 = text_ypix((t_text *)x,glist);
  iVar2 = (x->x_gui).x_w;
  iVar6 = (x->x_gui).x_h / 2;
  iVar3 = (x->x_gui).x_h;
  iVar7 = (x->x_gui).x_h / 4;
  tag._124_4_ = iVar1 * 7;
  tag._120_4_ = iVar1 * 3;
  local_fc = (x->x_gui).x_lcol;
  local_100 = (x->x_gui).x_fcol;
  local_138[0] = 2;
  fontatoms[0]._0_8_ = gensym((x->x_gui).x_font);
  fontatoms[0].a_w.w_float = 1.4013e-45;
  fontatoms[1].a_type = (t_atomtype)(float)(-(x->x_gui).x_fontsize * iVar1);
  fontatoms[1].a_w.w_float = 2.8026e-45;
  fontatoms[2]._0_8_ = gensym(sys_fontweight);
  if (((uint)(x->x_gui).x_fsf >> 0x18 & 1) != 0) {
    local_fc = 0xff;
    local_100 = 0xff;
  }
  if (((uint)(x->x_gui).x_fsf >> 0x1b & 1) != 0) {
    local_100 = 0xff0000;
  }
  my_numbox_ftoa(x);
  sprintf((char *)&fcol,"%lxBASE1",x);
  uVar9 = CONCAT44(uVar10,iVar5);
  uVar12 = CONCAT44(uVar14,iVar5);
  uVar13 = CONCAT44(uVar17,iVar5 + iVar7);
  pdgui_vmess((char *)0x0,"crs  ii ii ii ii ii ii",p_Var8,"coords",&fcol,(ulong)uVar4,uVar9,
              CONCAT44(uVar11,(uVar4 + iVar2) - iVar7),uVar12,CONCAT44(uVar16,uVar4 + iVar2),uVar13,
              uVar4 + iVar2,iVar5 + (x->x_gui).x_h,uVar4,iVar5 + (x->x_gui).x_h,uVar4,iVar5);
  uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),iVar1);
  uVar11 = 0;
  uVar12 = uVar12 & 0xffffffff00000000;
  uVar16 = 0;
  uVar13 = CONCAT44((int)((ulong)uVar13 >> 0x20),(x->x_gui).x_bcol);
  pdgui_vmess((char *)0x0,"crs  ri rk rk",p_Var8,"itemconfigure",&fcol,"-width",uVar9,"-outline",
              uVar12,"-fill",uVar13);
  uVar17 = (undefined4)((ulong)uVar13 >> 0x20);
  uVar14 = (undefined4)(uVar12 >> 0x20);
  uVar10 = (undefined4)((ulong)uVar9 >> 0x20);
  sprintf((char *)&fcol,"%lxBASE2",x);
  uVar9 = CONCAT44(uVar10,iVar5 + iVar1);
  uVar13 = CONCAT44(uVar14,iVar5 + iVar6);
  uVar15 = CONCAT44(uVar16,uVar4 + iVar1);
  pdgui_vmess((char *)0x0,"crs  ii ii ii",p_Var8,"coords",&fcol,(ulong)(uVar4 + iVar1),uVar9,
              CONCAT44(uVar11,uVar4 + iVar6),uVar13,uVar15,
              CONCAT44(uVar17,(iVar5 + (x->x_gui).x_h) - iVar1));
  uVar14 = (undefined4)((ulong)uVar15 >> 0x20);
  uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),iVar1);
  pdgui_vmess((char *)0x0,"crs  ri rk",p_Var8,"itemconfigure",&fcol,"-width",uVar9,"-fill",
              CONCAT44((int)((ulong)uVar13 >> 0x20),(x->x_gui).x_fcol));
  uVar10 = (undefined4)((ulong)uVar9 >> 0x20);
  sprintf((char *)&fcol,"%lxLABEL",x);
  uVar9 = CONCAT44(uVar10,iVar5 + (x->x_gui).x_ldy * iVar1);
  pdgui_vmess((char *)0x0,"crs  ii",p_Var8,"coords",&fcol,(ulong)(uVar4 + (x->x_gui).x_ldx * iVar1),
              uVar9);
  uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),3);
  uVar11 = 0;
  pdgui_vmess((char *)0x0,"crs  rA rk",p_Var8,"itemconfigure",&fcol,"-font",uVar9,local_138,"-fill",
              CONCAT44(uVar14,local_fc));
  uVar10 = (undefined4)((ulong)uVar9 >> 0x20);
  iemgui_dolabel(x,&x->x_gui,(x->x_gui).x_lab,1);
  sprintf((char *)&fcol,"%lxNUMBER",x);
  pdgui_vmess((char *)0x0,"crs  ii",p_Var8,"coords",&fcol,(ulong)(uVar4 + iVar6 + iVar1 * 2),
              CONCAT44(uVar10,iVar5 + iVar6 + iVar1 + iVar3 / (iVar1 * 0x22)));
  pdgui_vmess((char *)0x0,"crs  rs rA rk",p_Var8,"itemconfigure",&fcol,"-text",x->x_buf,"-font",
              CONCAT44(uVar11,3),local_138,"-fill",local_100);
  return;
}

Assistant:

static void my_numbox_draw_config(t_my_numbox* x, t_glist* glist)
{
    const int zoom = IEMGUI_ZOOM(x);
    t_canvas *canvas = glist_getcanvas(glist);
    t_iemgui *iemgui = &x->x_gui;
    int xpos = text_xpix(&x->x_gui.x_obj, glist);
    int ypos = text_ypix(&x->x_gui.x_obj, glist);
    int w = x->x_gui.x_w, half = x->x_gui.x_h/2;
    int d = zoom + x->x_gui.x_h/(34*zoom);
    int corner = x->x_gui.x_h/4;
    int iow = IOWIDTH * zoom, ioh = IEM_GUI_IOHEIGHT * zoom;
    char tag[128];

    int lcol = x->x_gui.x_lcol;
    int fcol = x->x_gui.x_fcol;
    t_atom fontatoms[3];
    SETSYMBOL(fontatoms+0, gensym(iemgui->x_font));
    SETFLOAT (fontatoms+1, -iemgui->x_fontsize*zoom);
    SETSYMBOL(fontatoms+2, gensym(sys_fontweight));

    if(x->x_gui.x_fsf.x_selected)
        fcol = lcol = IEM_GUI_COLOR_SELECTED;
    if(x->x_gui.x_fsf.x_change)
        fcol =  IEM_GUI_COLOR_EDITED;

    my_numbox_ftoa(x);

    sprintf(tag, "%lxBASE1", x);
    pdgui_vmess(0, "crs  ii ii ii ii ii ii", canvas, "coords", tag,
        xpos,              ypos,
        xpos + w - corner, ypos,
        xpos + w,          ypos + corner,
        xpos + w,          ypos + x->x_gui.x_h,
        xpos,              ypos + x->x_gui.x_h,
        xpos,              ypos);
    pdgui_vmess(0, "crs  ri rk rk", canvas, "itemconfigure", tag,
        "-width", zoom,
        "-outline", IEM_GUI_COLOR_NORMAL,
        "-fill", x->x_gui.x_bcol);


    sprintf(tag, "%lxBASE2", x);
    pdgui_vmess(0, "crs  ii ii ii", canvas, "coords", tag,
        xpos + zoom, ypos + zoom,
        xpos + half, ypos + half,
        xpos + zoom, ypos + x->x_gui.x_h - zoom);
    pdgui_vmess(0, "crs  ri rk", canvas, "itemconfigure", tag,
        "-width", zoom,
        "-fill", x->x_gui.x_fcol);

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs  ii", canvas, "coords", tag,
        xpos + x->x_gui.x_ldx * zoom,
        ypos + x->x_gui.x_ldy * zoom);
    pdgui_vmess(0, "crs  rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", lcol);
    iemgui_dolabel(x, &x->x_gui, x->x_gui.x_lab, 1);

    sprintf(tag, "%lxNUMBER", x);
    pdgui_vmess(0, "crs  ii", canvas, "coords", tag,
        xpos + half + 2*zoom, ypos + half + d);
    pdgui_vmess(0, "crs  rs rA rk", canvas, "itemconfigure", tag,
        "-text", x->x_buf,
        "-font", 3, fontatoms,
        "-fill", fcol);
}